

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O2

Token __thiscall
slang::parsing::NumberParser::finishValue
          (NumberParser *this,Token firstToken,bool singleToken,bool isNegated)

{
  SVInt *this_00;
  BumpAllocator *alloc;
  SourceLocation location;
  int iVar1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  uint computedWidth;
  bitwidth_t bVar2;
  __extent_storage<18446744073709551615UL> in_R9;
  Token TVar3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  bool singleToken_local;
  SVInt result;
  bool isNegated_local;
  string_view local_a8;
  anon_class_16_2_3c4fafbd checkOverflow;
  anon_class_24_3_421b894d createResult;
  Token firstToken_local;
  SVInt local_50;
  pointer local_40;
  size_type sStack_38;
  
  firstToken_local.info = firstToken.info;
  firstToken_local._0_8_ = firstToken._0_8_;
  createResult.firstToken = &firstToken_local;
  createResult.singleToken = &singleToken_local;
  checkOverflow.isNegated = &isNegated_local;
  singleToken_local = singleToken;
  isNegated_local = isNegated;
  checkOverflow.this = this;
  createResult.this = this;
  if (this->valid == false) {
    alloc = this->alloc;
    trivia = Token::trivia(&firstToken_local);
    if (singleToken_local == true) {
      local_a8 = Token::rawText(&firstToken_local);
    }
    else {
      iVar1 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)trivia._M_extent._M_extent_value._M_extent_value);
      local_a8._M_str._4_4_ = extraout_var;
      local_a8._M_str._0_4_ = iVar1;
      local_a8._M_len = extraout_RDX;
    }
    location = this->firstLocation;
    SVInt::SVInt<int>(&local_50,0);
    Token::Token((Token *)&result,alloc,IntegerLiteral,trivia,local_a8,location,&local_50);
    SVInt::~SVInt(&local_50);
    TVar3._1_7_ = result.super_SVIntStorage.field_0.val._1_7_;
    TVar3.kind._0_1_ = result.super_SVIntStorage.field_0.val._0_1_;
    TVar3.info._0_4_ = result.super_SVIntStorage.bitWidth;
    TVar3.info._4_1_ = result.super_SVIntStorage.signFlag;
    TVar3.info._5_1_ = result.super_SVIntStorage.unknownFlag;
    TVar3.info._6_2_ = result.super_SVIntStorage._14_2_;
    return TVar3;
  }
  if ((this->literalBase != 2) || (this->hasUnknown != false)) {
    if ((this->digits).super_SmallVectorBase<slang::logic_t>.len != 0) {
      TVar3 = (Token)(*(code *)(&DAT_0044e6b8 +
                               *(int *)(&DAT_0044e6b8 + (ulong)(uint)this->literalBase * 4)))();
      return TVar3;
    }
    result.super_SVIntStorage.field_0.val._0_1_ = 0;
    SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
              (&(this->digits).super_SmallVectorBase<slang::logic_t>,(logic_t *)&result);
    bVar2 = 0x20;
    if (this->sizeBits != 0) {
      bVar2 = this->sizeBits;
    }
    digits._M_ptr = (pointer)(ulong)this->hasUnknown;
    local_40 = (this->digits).super_SmallVectorBase<slang::logic_t>.data_;
    sStack_38 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    digits._M_extent._M_extent_value = in_R9._M_extent_value;
    SVInt::fromDigits((bitwidth_t)&result,(LiteralBase)bVar2,(bool)this->literalBase,this->signFlag,
                      digits);
    TVar3 = finishValue(slang::parsing::Token,bool,bool)::$_0::operator()
                      ((__0 *)&createResult,&result);
    goto LAB_00352b40;
  }
  this_00 = &this->decimalValue;
  computedWidth = (this->decimalValue).super_SVIntStorage.bitWidth;
  bVar2 = (bitwidth_t)this_00;
  if (this->signFlag == true) {
    computedWidth = computedWidth + 1;
    SVInt::resize(&result,bVar2);
    SVInt::operator=(this_00,&result);
    SVInt::~SVInt(&result);
  }
  result.super_SVIntStorage.field_0.val._0_1_ = 0;
  result.super_SVIntStorage.field_0.val._1_7_ = 0;
  result.super_SVIntStorage.bitWidth = 1;
  result.super_SVIntStorage.signFlag = false;
  result.super_SVIntStorage.unknownFlag = false;
  if (this->sizeBits == 0) {
    if (0x1f < computedWidth) goto LAB_00352a97;
    SVInt::resize((SVInt *)&local_a8,bVar2);
    SVInt::operator=(&result,(SVInt *)&local_a8);
    SVInt::~SVInt((SVInt *)&local_a8);
  }
  else if (computedWidth == this->sizeBits) {
LAB_00352a97:
    SVInt::operator=(&result,this_00);
  }
  else {
    SVInt::resize((SVInt *)&local_a8,bVar2);
    SVInt::operator=(&result,(SVInt *)&local_a8);
    SVInt::~SVInt((SVInt *)&local_a8);
    if (this->sizeBits < computedWidth) {
      finishValue::anon_class_16_2_3c4fafbd::operator()(&checkOverflow,computedWidth,&result);
    }
  }
  result.super_SVIntStorage.signFlag = this->signFlag;
  TVar3 = finishValue(slang::parsing::Token,bool,bool)::$_0::operator()
                    ((__0 *)&createResult,&result);
LAB_00352b40:
  SVInt::~SVInt(&result);
  return TVar3;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken, bool isNegated) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    auto checkOverflow = [&](bitwidth_t computedWidth, const SVInt& value) {
        // Special case to avoid the warning when we have a minus operator preceeding
        // a min value signed negative integer, with no unknowns.
        if (isNegated && signFlag && !hasUnknown && computedWidth == sizeBits + 1 &&
            value.isNegative() && value.countOnes() == 1) {
            return;
        }

        addDiag(diag::VectorLiteralOverflow, firstLocation) << computedWidth;
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal && !hasUnknown) {
        // If we added an x or z, we will fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        bitwidth_t width = decimalValue.getBitWidth();
        if (signFlag) {
            width++;
            decimalValue = decimalValue.resize(width);
        }

        // If no size was specified, just return the value as-is. Otherwise,
        // resize it to match the desired size. Warn if that will truncate.
        SVInt result;
        if (!sizeBits) {
            // Unsized numbers are required to be at least 32 bits by the spec.
            if (width < 32)
                result = decimalValue.resize(32);
            else
                result = std::move(decimalValue);
        }
        else if (width != sizeBits) {
            result = decimalValue.resize(sizeBits);
            if (width > sizeBits)
                checkOverflow(width, result);
        }
        else {
            result = std::move(decimalValue);
        }

        result.setSigned(signFlag);
        return createResult(std::move(result));
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += (bitwidth_t)std::bit_width(digits[0].value);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                auto result = SVInt::fromDigits(sizeBits, literalBase, signFlag, hasUnknown,
                                                digits);
                checkOverflow(bits, result);
                return createResult(std::move(result));
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}